

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
kratos::get_target_var_name_abi_cxx11_
          (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,kratos *this,Var *var)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> scope_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  
  plVar3 = *(long **)(this + 0x50);
  plVar1 = *(long **)(this + 0x58);
  do {
    if (plVar3 == plVar1) {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    pcVar4 = (char *)(*plVar3 + 0x28);
    lVar2 = std::__cxx11::string::rfind(pcVar4,0x22c081);
    plVar3 = plVar3 + 2;
  } while (lVar2 != 0);
  std::__cxx11::string::rfind((char)pcVar4,0x3a);
  std::__cxx11::string::substr((ulong)local_78,(ulong)pcVar4);
  std::__cxx11::string::substr((ulong)((long)&scope_name.field_2 + 8),(ulong)pcVar4);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&scope_name.field_2 + 8));
  std::
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            (__return_storage_ptr__,&local_b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_b8);
  std::__cxx11::string::~string((string *)(scope_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<std::string, std::string>> get_target_var_name(const Var *var) {
    auto const &attrs = var->get_attributes();
    for (auto const &attr : attrs) {
        auto const &value_str = attr->value_str;
        if (value_str.rfind("ssa=") == 0) {
            auto pos = value_str.rfind(':');
            auto scope_name = value_str.substr(4, pos - 4);
            auto var_name = value_str.substr(pos + 1);
            return std::make_pair(scope_name, var_name);
        }
    }
    return std::nullopt;
}